

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O2

void __thiscall
soplex::ClassArray<soplex::Nonzero<double>_>::ClassArray
          (ClassArray<soplex::Nonzero<double>_> *this,int p_size,int p_max,double p_fac)

{
  int n;
  int *piVar1;
  int iVar2;
  long lVar3;
  
  this->_vptr_ClassArray = (_func_int **)&PTR__ClassArray_0053dcd8;
  this->data = (Nonzero<double> *)0x0;
  this->memFactor = p_fac;
  lVar3 = 0;
  iVar2 = p_size;
  if (p_size < 1) {
    iVar2 = 0;
  }
  this->thesize = iVar2;
  n = 1;
  if (0 < p_size) {
    n = iVar2;
  }
  if (iVar2 < p_max) {
    n = p_max;
  }
  this->themax = n;
  spx_alloc<soplex::Nonzero<double>*>(&this->data,n);
  iVar2 = this->themax;
  piVar1 = &this->data->idx;
  for (; lVar3 < iVar2; lVar3 = lVar3 + 1) {
    ((Nonzero<double> *)(piVar1 + -2))->val = 0.0;
    *piVar1 = 0;
    piVar1 = piVar1 + 4;
  }
  return;
}

Assistant:

explicit ClassArray(int p_size = 0, int p_max = 0, double p_fac = 1.2)
      : data(nullptr)
      , memFactor(p_fac)
   {
      thesize = (p_size < 0) ? 0 : p_size;

      if(p_max > thesize)
         themax = p_max;
      else
         themax = (thesize == 0) ? 1 : thesize;

      spx_alloc(data, max());

      /* call default constructor for each element */
      for(int i = 0; i < max(); i++)
         new(&(data[i])) T();

      assert(isConsistent());
   }